

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_table_filter.cpp
# Opt level: O3

void __thiscall duckdb::ConstantFilter::Serialize(ConstantFilter *this,Serializer *serializer)

{
  (*serializer->_vptr_Serializer[2])(serializer,100,"filter_type");
  Serializer::WriteValue<duckdb::TableFilterType>(serializer,(this->super_TableFilter).filter_type);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,200,"comparison_type");
  Serializer::WriteValue<duckdb::ExpressionType>(serializer,(this->super_TableFilter).field_0x9);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WriteProperty<duckdb::Value>(serializer,0xc9,"constant",&this->constant);
  return;
}

Assistant:

void ConstantFilter::Serialize(Serializer &serializer) const {
	TableFilter::Serialize(serializer);
	serializer.WriteProperty<ExpressionType>(200, "comparison_type", comparison_type);
	serializer.WriteProperty<Value>(201, "constant", constant);
}